

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vw_validate.cc
# Opt level: O3

void VW::validate_num_bits(vw *all)

{
  ostream *poVar1;
  vw_exception *this;
  stringstream __msg;
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190;
  
  if (all->num_bits < 0x3e) {
    return;
  }
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(&local_190,"Only ",5);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&local_190);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1," or fewer bits allowed.  If this is a serious limit, speak up.",0x3e);
  this = (vw_exception *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  vw_exception::vw_exception
            (this,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/vw_validate.cc"
             ,0x23,&local_1c0);
  __cxa_throw(this,&vw_exception::typeinfo,vw_exception::~vw_exception);
}

Assistant:

void validate_num_bits(vw& all)
{
  if (all.num_bits > sizeof(size_t) * 8 - 3)
    THROW("Only " << sizeof(size_t) * 8 - 3 << " or fewer bits allowed.  If this is a serious limit, speak up.");
}